

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O0

void Msat_ClausePrintSymbols(Msat_Clause_t *pC)

{
  char *pcVar1;
  int local_14;
  int i;
  Msat_Clause_t *pC_local;
  
  if (pC == (Msat_Clause_t *)0x0) {
    printf("NULL pointer");
  }
  else {
    for (local_14 = 0; local_14 < (int)(*(uint *)&pC->field_0x4 >> 3 & 0x3fff);
        local_14 = local_14 + 1) {
      pcVar1 = "";
      if (((&pC[1].Num)[local_14] & 1U) != 0) {
        pcVar1 = "-";
      }
      printf(" %s%d",pcVar1,(ulong)(((&pC[1].Num)[local_14] >> 1) + 1));
    }
  }
  printf("\n");
  return;
}

Assistant:

void Msat_ClausePrintSymbols( Msat_Clause_t * pC )
{
    int i;
    if ( pC == NULL )
        printf( "NULL pointer" );
    else 
    {
//        if ( pC->fLearned )
//            printf( "Act = %.4f  ", Msat_ClauseReadActivity(pC) );
        for ( i = 0; i < (int)pC->nSize; i++ )
            printf(" "L_LIT, L_lit(pC->pData[i]));
    }
    printf( "\n" );
}